

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opextinst_forward_ref_fixup_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::OpExtInstWithForwardReferenceFixupPass::Process
          (OpExtInstWithForwardReferenceFixupPass *this)

{
  Module *pMVar1;
  Instruction *this_00;
  Status SVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Op OVar6;
  Operand *this_01;
  size_type sVar7;
  undefined8 extraout_RAX;
  FeatureManager *pFVar8;
  Op OVar9;
  bool bVar10;
  value_type *extraout_RDX;
  value_type *__v;
  value_type *extraout_RDX_00;
  value_type *__v_00;
  uint32_t index;
  __node_base *p_Var11;
  Instruction **ppIVar12;
  allocator<char> local_d5;
  uint local_d4;
  IRContext *local_d0;
  Instruction *local_c8;
  uint32_t id;
  undefined4 uStack_bc;
  iterator local_b8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  debug_ids;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  debug_ids._M_h._M_buckets =
       *(__buckets_ptr *)
        ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  debug_ids._M_h._M_bucket_count =
       (long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8;
  anon_unknown_11::gatherResultIds
            (&seen_ids,(IteratorRange<spvtools::opt::InstructionList::iterator> *)&debug_ids);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  _id = *(pointer *)
         ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
         0x10);
  local_b8.super_iterator.node_ =
       (iterator)
       ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  anon_unknown_11::gatherResultIds
            (&debug_ids,(IteratorRange<spvtools::opt::InstructionList::iterator> *)&id);
  p_Var11 = &seen_ids._M_h._M_before_begin;
  __v = extraout_RDX;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    id = (int)*(size_type *)(p_Var11 + 1);
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((__ireturn_type *)&debug_ids,
             (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&id,__v);
    __v = extraout_RDX_00;
  }
  local_d0 = (this->super_Pass).context_;
  pMVar1 = (local_d0->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_c8 = (Instruction *)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             8);
  bVar10 = false;
  local_d4 = 0;
  ppIVar12 = (Instruction **)
             ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  while (this_00 = *ppIVar12, this_00 != local_c8) {
    if ((this_00->opcode_ == OpExtInstWithForwardRefsKHR) || (this_00->opcode_ == OpExtInst)) {
      uVar4 = Instruction::result_id(this_00);
      id = uVar4;
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((__ireturn_type *)&seen_ids,
               (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&id,__v_00);
      uVar4 = Instruction::NumInOperands(this_00);
      for (index = 0; uVar4 != index; index = index + 1) {
        this_01 = Instruction::GetInOperand(this_00,index);
        bVar3 = spvIsIdType(this_01->type);
        if (bVar3) {
          uVar5 = Operand::AsId(this_01);
          id = uVar5;
          sVar7 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&debug_ids._M_h,(key_type_conflict *)&id);
          if (sVar7 != 0) {
            uVar5 = Operand::AsId(this_01);
            id = uVar5;
            sVar7 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&seen_ids._M_h,(key_type_conflict *)&id);
            if (sVar7 == 0) {
              OVar6 = this_00->opcode_;
              if (index < uVar4) {
                OVar9 = OpExtInstWithForwardRefsKHR;
                bVar10 = true;
                if (OVar6 == OpExtInstWithForwardRefsKHR) goto LAB_004d530e;
                goto LAB_004d52f7;
              }
              bVar10 = (bool)(bVar10 | index < uVar4);
              goto LAB_004d52ef;
            }
          }
        }
      }
      OVar6 = this_00->opcode_;
LAB_004d52ef:
      OVar9 = OpExtInst;
      if (OVar6 != OpExtInst) {
LAB_004d52f7:
        this_00->opcode_ = OVar9;
        IRContext::AnalyzeUses(local_d0,this_00);
        local_d4 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
    }
LAB_004d530e:
    ppIVar12 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pFVar8 = IRContext::get_feature_mgr(local_d0);
  bVar3 = EnumSet<spvtools::Extension>::contains
                    (&pFVar8->extensions_,kSPV_KHR_relaxed_extended_instruction);
  if (bVar3 == bVar10) {
    if ((local_d4 & 1) == 0) {
      SVar2 = SuccessWithoutChange;
      goto LAB_004d53b1;
    }
  }
  else if (bVar10 == false) {
    IRContext::RemoveExtension(local_d0,kSPV_KHR_relaxed_extended_instruction);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&id,"SPV_KHR_relaxed_extended_instruction",&local_d5);
    IRContext::AddExtension(local_d0,(string *)&id);
    std::__cxx11::string::_M_dispose();
  }
  SVar2 = SuccessWithChange;
LAB_004d53b1:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&debug_ids._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&seen_ids._M_h);
  return SVar2;
}

Assistant:

Pass::Status OpExtInstWithForwardReferenceFixupPass::Process() {
  std::unordered_set<uint32_t> seen_ids =
      gatherResultIds(get_module()->ext_inst_imports());
  std::unordered_set<uint32_t> debug_ids =
      gatherResultIds(get_module()->ext_inst_debuginfo());
  for (uint32_t id : seen_ids) debug_ids.insert(id);

  bool moduleChanged = false;
  bool hasAtLeastOneForwardReference = false;
  IRContext* ctx = context();
  for (Instruction& inst : get_module()->ext_inst_debuginfo()) {
    if (inst.opcode() != spv::Op::OpExtInst &&
        inst.opcode() != spv::Op::OpExtInstWithForwardRefsKHR)
      continue;

    seen_ids.insert(inst.result_id());
    bool hasForwardReferences = HasForwardReference(inst, debug_ids, seen_ids);
    hasAtLeastOneForwardReference |= hasForwardReferences;

    if (ReplaceOpcodeIfRequired(inst, hasForwardReferences)) {
      moduleChanged = true;
      ctx->AnalyzeUses(&inst);
    }
  }

  if (hasAtLeastOneForwardReference !=
      ctx->get_feature_mgr()->HasExtension(
          kSPV_KHR_relaxed_extended_instruction)) {
    if (hasAtLeastOneForwardReference)
      ctx->AddExtension("SPV_KHR_relaxed_extended_instruction");
    else
      ctx->RemoveExtension(Extension::kSPV_KHR_relaxed_extended_instruction);
    moduleChanged = true;
  }

  return moduleChanged ? Status::SuccessWithChange
                       : Status::SuccessWithoutChange;
}